

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O0

int yy_init_globals(yyscan_t yyscanner)

{
  yyguts_t_conflict *yyg;
  yyscan_t yyscanner_local;
  
  *(undefined8 *)((long)yyscanner + 0x28) = 0;
  *(undefined8 *)((long)yyscanner + 0x18) = 0;
  *(undefined8 *)((long)yyscanner + 0x20) = 0;
  *(undefined8 *)((long)yyscanner + 0x40) = 0;
  *(undefined4 *)((long)yyscanner + 0x48) = 0;
  *(undefined4 *)((long)yyscanner + 0x4c) = 0;
  *(undefined4 *)((long)yyscanner + 0x54) = 0;
  *(undefined4 *)((long)yyscanner + 0x58) = 0;
  *(undefined8 *)((long)yyscanner + 0x60) = 0;
  *(undefined8 *)((long)yyscanner + 8) = 0;
  *(undefined8 *)((long)yyscanner + 0x10) = 0;
  return 0;
}

Assistant:

static int yy_init_globals (yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;
    /* Initialization is the same as for the non-reentrant scanner.
     * This function is called from yylex_destroy(), so don't allocate here.
     */

    yyg->yy_buffer_stack = NULL;
    yyg->yy_buffer_stack_top = 0;
    yyg->yy_buffer_stack_max = 0;
    yyg->yy_c_buf_p = NULL;
    yyg->yy_init = 0;
    yyg->yy_start = 0;

    yyg->yy_start_stack_ptr = 0;
    yyg->yy_start_stack_depth = 0;
    yyg->yy_start_stack =  NULL;

/* Defined in main.c */
#ifdef YY_STDINIT
    yyin = stdin;
    yyout = stdout;
#else
    yyin = NULL;
    yyout = NULL;
#endif

    /* For future reference: Set errno on error, since we are called by
     * yylex_init()
     */
    return 0;
}